

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O2

int kws_search_step(ps_search_t *search,int frame_idx)

{
  acmod_t *acmod;
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  int32 iVar4;
  _func_int_ps_search_t_ptr *p_Var5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char **ppcVar9;
  int iVar10;
  int iVar11;
  char **ppcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int local_3c;
  char **local_38;
  
  acmod = search->acmod;
  local_3c = frame_idx;
  if (acmod->compallsen == '\0') {
    acmod_clear_active(acmod);
    lVar15 = 0;
    for (lVar13 = 0; lVar13 < *(int *)&search[1].dict; lVar13 = lVar13 + 1) {
      acmod_activate_hmm(search->acmod,(hmm_t *)((long)&(search[1].d2p)->refcount + lVar15));
      lVar15 = lVar15 + 0x58;
    }
    ppcVar12 = &search[1].type;
    while (plVar1 = (long *)*ppcVar12, plVar1 != (long *)0x0) {
      lVar13 = *plVar1;
      lVar14 = 0;
      for (lVar15 = 0; lVar15 < *(int *)(lVar13 + 0x18); lVar15 = lVar15 + 1) {
        lVar8 = *(long *)(lVar13 + 0x10);
        if (0 < *(int *)(lVar8 + 0x4c + lVar14)) {
          acmod_activate_hmm(search->acmod,(hmm_t *)(lVar8 + lVar14));
        }
        lVar14 = lVar14 + 0x58;
      }
      ppcVar12 = (char **)(plVar1 + 1);
    }
  }
  p_Var5 = (_func_int_ps_search_t_ptr *)acmod_score(acmod,&local_3c);
  (search[1].vt)->finish = p_Var5;
  iVar10 = -0x20000000;
  lVar13 = 0;
  for (lVar15 = 0; lVar15 < *(int *)&search[1].dict; lVar15 = lVar15 + 1) {
    iVar4 = hmm_vit_eval((hmm_t *)((long)&(search[1].d2p)->refcount + lVar13));
    if (iVar10 < iVar4) {
      iVar10 = iVar4;
    }
    lVar13 = lVar13 + 0x58;
  }
  ppcVar12 = &search[1].type;
  local_38 = ppcVar12;
  while (plVar1 = (long *)*ppcVar12, plVar1 != (long *)0x0) {
    lVar13 = *plVar1;
    lVar15 = 0;
    for (lVar14 = 0; lVar14 < *(int *)(lVar13 + 0x18); lVar14 = lVar14 + 1) {
      lVar8 = *(long *)(lVar13 + 0x10);
      if ((0 < *(int *)(lVar8 + 0x4c + lVar15)) &&
         (iVar4 = hmm_vit_eval((hmm_t *)(lVar8 + lVar15)), iVar10 < iVar4)) {
        iVar10 = iVar4;
      }
      lVar15 = lVar15 + 0x58;
    }
    ppcVar12 = (char **)(plVar1 + 1);
  }
  *(int *)((long)&search[1].config + 4) = iVar10;
  iVar11 = *(int *)((long)&search[1].pls + 4);
  ppcVar12 = local_38;
  while (ppcVar9 = local_38, plVar1 = (long *)*ppcVar12, plVar1 != (long *)0x0) {
    lVar13 = *plVar1;
    lVar15 = 0;
    for (lVar14 = 0; lVar14 < *(int *)(lVar13 + 0x18); lVar14 = lVar14 + 1) {
      lVar8 = *(long *)(lVar13 + 0x10);
      if ((0 < *(int *)(lVar8 + 0x4c + lVar15)) &&
         (*(int *)(lVar8 + 0x44 + lVar15) < iVar10 + iVar11)) {
        hmm_clear((hmm_t *)(lVar8 + lVar15));
      }
      lVar15 = lVar15 + 0x58;
    }
    ppcVar12 = (char **)(plVar1 + 1);
  }
  uVar6 = 0;
  uVar7 = (ulong)*(uint *)&search[1].dict;
  if ((int)*(uint *)&search[1].dict < 1) {
    uVar7 = uVar6;
  }
  iVar10 = -0x20000000;
  lVar13 = 0;
  for (; uVar7 * 0x58 - uVar6 != 0; uVar6 = uVar6 + 0x58) {
    iVar11 = *(int *)((long)&(search[1].d2p)->lrssid + uVar6);
    if (iVar10 < iVar11) {
      lVar13 = (long)&(search[1].d2p)->refcount + uVar6;
      iVar10 = iVar11;
    }
  }
  ppcVar12 = local_38;
  if (lVar13 != 0) {
    while (plVar1 = (long *)*ppcVar12, plVar1 != (long *)0x0) {
      puVar2 = (undefined8 *)*plVar1;
      if (0 < (long)*(int *)(puVar2 + 3)) {
        lVar15 = (long)*(int *)(puVar2 + 3) * 0x58;
        if ((0 < *(int *)(puVar2[2] + -0xc + lVar15)) && (-0x20000000 < *(int *)(lVar13 + 0x30))) {
          lVar15 = puVar2[2] + lVar15;
          iVar10 = *(int *)(lVar15 + -0x28);
          iVar11 = iVar10 - *(int *)(lVar13 + 0x30);
          if (*(int *)(puVar2 + 1) <= iVar11) {
            kws_detections_add((kws_detections_t *)search[1].name,(char *)*puVar2,
                               *(int *)(lVar15 + -0x24),*(int *)&search[1].pls,iVar11 + -0x5dc,
                               iVar10);
          }
        }
      }
      ppcVar12 = (char **)(plVar1 + 1);
    }
    lVar15 = 0;
    for (lVar14 = 0; lVar14 < *(int *)&search[1].dict; lVar14 = lVar14 + 1) {
      iVar10 = *(int *)&search[1].config + *(int *)(lVar13 + 0x30);
      if (*(int *)((long)&(search[1].d2p)->mdef + lVar15) < iVar10) {
        hmm_enter((hmm_t *)((long)&(search[1].d2p)->refcount + lVar15),iVar10,
                  *(int32 *)(lVar13 + 0x34),*(int *)&search[1].pls + 1);
      }
      lVar15 = lVar15 + 0x58;
    }
    while (plVar1 = (long *)*ppcVar9, plVar1 != (long *)0x0) {
      lVar15 = *plVar1;
      lVar14 = (long)*(int *)(lVar15 + 0x18);
      if (0 < lVar14) {
        lVar8 = lVar14 * 0x58 + -0x80;
        for (; 1 < lVar14; lVar14 = lVar14 + -1) {
          lVar3 = *(long *)(lVar15 + 0x10);
          if ((0 < *(int *)(lVar3 + 0x1c + lVar8)) &&
             ((*(int *)(lVar3 + 0x74 + lVar8) < 1 ||
              (*(int *)(lVar3 + 0x30 + lVar8) < *(int32 *)(lVar3 + lVar8))))) {
            hmm_enter((hmm_t *)(lVar3 + lVar8 + 0x28),*(int32 *)(lVar3 + lVar8),
                      *(int32 *)(lVar3 + lVar8 + 4),*(int *)&search[1].pls + 1);
          }
          lVar8 = lVar8 + -0x58;
        }
        if ((*(hmm_t **)(lVar15 + 0x10))->score[0] < *(int32 *)(lVar13 + 0x30)) {
          hmm_enter(*(hmm_t **)(lVar15 + 0x10),*(int32 *)(lVar13 + 0x30),*(int *)&search[1].pls,
                    *(int *)&search[1].pls + 1);
        }
      }
      ppcVar9 = (char **)(plVar1 + 1);
    }
  }
  *(int *)&search[1].pls = *(int *)&search[1].pls + 1;
  return 0;
}

Assistant:

int
kws_search_step(ps_search_t * search, int frame_idx)
{
    int16 const *senscr;
    kws_search_t *kwss = (kws_search_t *) search;
    acmod_t *acmod = search->acmod;

    /* Activate senones */
    if (!acmod->compallsen)
        kws_search_sen_active(kwss);

    /* Calculate senone scores for current frame. */
    senscr = acmod_score(acmod, &frame_idx);

    /* Evaluate hmms in phone loop and in active keyphrase nodes */
    kws_search_hmm_eval(kwss, senscr);

    /* Prune hmms with low prob */
    kws_search_hmm_prune(kwss);

    /* Do hmms transitions */
    kws_search_trans(kwss);

    ++kwss->frame;
    return 0;
}